

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O3

void __thiscall xemmai::t_lexer::f_read_indent(t_lexer *this)

{
  wchar_t wVar1;
  int iVar2;
  wchar_t *pwVar3;
  wint_t __wc;
  
  __wc = this->v_c;
  if (__wc != 10) {
    do {
      iVar2 = iswspace(__wc);
      if (iVar2 == 0) {
        return;
      }
      wVar1 = this->v_c;
      pwVar3 = (this->v_indent).v_i;
      if (pwVar3 == (this->v_indent).v_j) {
        t_stringer::f_grow(&this->v_indent);
        pwVar3 = (this->v_indent).v_i;
      }
      (this->v_indent).v_i = pwVar3 + 1;
      *pwVar3 = wVar1;
      f_get(this);
      __wc = this->v_c;
    } while (__wc != 10);
  }
  return;
}

Assistant:

void f_read_indent()
	{
		while (v_c != L'\n' && std::iswspace(v_c)) {
			v_indent << v_c;
			f_get();
		}
	}